

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O2

uint tinf_crc32(void *data,uint length)

{
  uint uVar1;
  ulong uVar2;
  
  if (length != 0) {
    uVar1 = 0xffffffff;
    for (uVar2 = 0; length != uVar2; uVar2 = uVar2 + 1) {
      uVar1 = uVar1 ^ *(byte *)((long)data + uVar2);
      uVar1 = uVar1 >> 4 ^ tinf_crc32tab[uVar1 & 0xf];
      uVar1 = uVar1 >> 4 ^ tinf_crc32tab[uVar1 & 0xf];
    }
    return ~uVar1;
  }
  return 0;
}

Assistant:

unsigned int tinf_crc32(const void *data, unsigned int length)
{
	const unsigned char *buf = (const unsigned char *) data;
	unsigned int crc = 0xFFFFFFFF;
	unsigned int i;

	if (length == 0) {
		return 0;
	}

	for (i = 0; i < length; ++i) {
		crc ^= buf[i];
		crc = tinf_crc32tab[crc & 0x0F] ^ (crc >> 4);
		crc = tinf_crc32tab[crc & 0x0F] ^ (crc >> 4);
	}

	return crc ^ 0xFFFFFFFF;
}